

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,PP_entry *pp)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  string *in_RSI;
  ostream *in_RDI;
  int i;
  int n;
  int iVar6;
  
  poVar2 = std::operator<<(in_RDI,in_RSI);
  poVar2 = std::operator<<(poVar2,"(nvals = ");
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0x20));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,") ");
  std::operator<<(poVar2," :: [");
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0x20));
  iVar1 = (int)sVar3;
  for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RSI + 0x20),(long)iVar6);
    std::operator<<(in_RDI,(string *)pvVar4);
    if (iVar6 < iVar1 + -1) {
      std::operator<<(in_RDI,", ");
    }
  }
  std::operator<<(in_RDI,"]");
  uVar5 = std::ios::operator!((ios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  if ((uVar5 & 1) != 0) {
    Error_host((char *)CONCAT44(iVar1,iVar6));
  }
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const ParmParse::PP_entry& pp)
{
    os << pp.m_name << "(nvals = " << pp.m_vals.size() << ") " << " :: [";
    int n = pp.m_vals.size();
    for ( int i = 0; i < n; i++ )
    {
        os << pp.m_vals[i];
        if ( i < n-1 ) os << ", ";
    }
    os << "]";

    if ( !os )
    {
        amrex::Error("write on ostream failed");
    }
    return os;
}